

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

char * cmsys::SystemTools::SplitPathRootComponent(string *p,string *root)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  
  pcVar2 = (p->_M_dataplus)._M_p;
  cVar1 = *pcVar2;
  if (cVar1 == '\0') goto LAB_0012a056;
  if (cVar1 == '\\') {
    if (pcVar2[1] != '\\') {
LAB_00129f95:
      if (root != (string *)0x0) {
        std::__cxx11::string::_M_replace((ulong)root,0,(char *)root->_M_string_length,0x1c7e9a);
      }
      return pcVar2 + 1;
    }
  }
  else {
    if (cVar1 != '/') {
      if ((pcVar2[1] == ':') && ((pcVar2[2] == '\\' || (pcVar2[2] == '/')))) {
        if (root != (string *)0x0) {
          std::__cxx11::string::_M_replace((ulong)root,0,(char *)root->_M_string_length,0x1c7e9c);
          *(root->_M_dataplus)._M_p = *pcVar2;
        }
        return pcVar2 + 3;
      }
      if (cVar1 == '\0') {
LAB_0012a056:
        if (root == (string *)0x0) {
          return pcVar2;
        }
        std::__cxx11::string::_M_replace((ulong)root,0,(char *)root->_M_string_length,0x1cd182);
        return pcVar2;
      }
      if (pcVar2[1] != ':') {
        if (cVar1 == '~') {
          for (lVar3 = 1; (pcVar2[lVar3] != '\0' && (pcVar2[lVar3] != '/')); lVar3 = lVar3 + 1) {
          }
          if (root != (string *)0x0) {
            std::__cxx11::string::_M_replace
                      ((ulong)root,0,(char *)root->_M_string_length,(ulong)pcVar2);
            std::__cxx11::string::push_back((char)root);
          }
          return pcVar2 + (ulong)(pcVar2[lVar3] == '/') + lVar3;
        }
        goto LAB_0012a056;
      }
      if (root != (string *)0x0) {
        std::__cxx11::string::_M_replace((ulong)root,0,(char *)root->_M_string_length,0x1c7ea0);
        *(root->_M_dataplus)._M_p = *pcVar2;
      }
      goto LAB_00129f7a;
    }
    if (pcVar2[1] != '/') goto LAB_00129f95;
  }
  if (root != (string *)0x0) {
    std::__cxx11::string::_M_replace((ulong)root,0,(char *)root->_M_string_length,0x1cc8ab);
  }
LAB_00129f7a:
  return pcVar2 + 2;
}

Assistant:

const char* SystemTools::SplitPathRootComponent(const std::string& p,
                                                std::string* root)
{
  // Identify the root component.
  const char* c = p.c_str();
  if ((c[0] == '/' && c[1] == '/') || (c[0] == '\\' && c[1] == '\\')) {
    // Network path.
    if (root) {
      *root = "//";
    }
    c += 2;
  } else if (c[0] == '/' || c[0] == '\\') {
    // Unix path (or Windows path w/out drive letter).
    if (root) {
      *root = "/";
    }
    c += 1;
  } else if (c[0] && c[1] == ':' && (c[2] == '/' || c[2] == '\\')) {
    // Windows path.
    if (root) {
      (*root) = "_:/";
      (*root)[0] = c[0];
    }
    c += 3;
  } else if (c[0] && c[1] == ':') {
    // Path relative to a windows drive working directory.
    if (root) {
      (*root) = "_:";
      (*root)[0] = c[0];
    }
    c += 2;
  } else if (c[0] == '~') {
    // Home directory.  The returned root should always have a
    // trailing slash so that appending components as
    // c[0]c[1]/c[2]/... works.  The remaining path returned should
    // skip the first slash if it exists:
    //
    //   "~"    : root = "~/" , return ""
    //   "~/    : root = "~/" , return ""
    //   "~/x   : root = "~/" , return "x"
    //   "~u"   : root = "~u/", return ""
    //   "~u/"  : root = "~u/", return ""
    //   "~u/x" : root = "~u/", return "x"
    size_t n = 1;
    while (c[n] && c[n] != '/') {
      ++n;
    }
    if (root) {
      root->assign(c, n);
      *root += '/';
    }
    if (c[n] == '/') {
      ++n;
    }
    c += n;
  } else {
    // Relative path.
    if (root) {
      *root = "";
    }
  }

  // Return the remaining path.
  return c;
}